

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_225::Inlining::run(Inlining *this,Module *module_)

{
  NameInfoMap *this_00;
  __node_base_ptr *pp_Var1;
  Index IVar2;
  uint uVar3;
  mapped_type mVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  Global *pGVar9;
  pointer puVar10;
  ElementSegment *pEVar11;
  pointer ppEVar12;
  pointer puVar13;
  DataSegment *pDVar14;
  pointer puVar15;
  Export *pEVar16;
  PassRunner *pPVar17;
  FunctionSplitter *pFVar18;
  pointer pIVar19;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
  *p_Var20;
  Name name_00;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  char *pcVar24;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
  *this_01;
  __node_base_ptr p_Var25;
  pointer pNVar26;
  bool bVar27;
  mapped_type *pmVar28;
  FunctionSplitter *pFVar29;
  Function *func_00;
  size_type sVar30;
  mapped_type *pmVar31;
  size_type sVar32;
  mapped_type *pmVar33;
  ulong uVar34;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar35;
  pointer puVar36;
  undefined1 auVar37 [8];
  Module *pMVar38;
  Function *pFVar39;
  Function *pFVar40;
  _Hash_node_base _Var41;
  pointer action;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer ppEVar42;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar43;
  pointer puVar44;
  pointer puVar45;
  undefined8 *puVar46;
  undefined8 *puVar47;
  _Hash_node_base *p_Var48;
  undefined1 local_2f0 [8];
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  iterationCounts;
  undefined1 auStack_298 [8];
  Name name;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  inlinedUses;
  __node_base local_1a8 [2];
  long local_198;
  Module *local_188;
  NameInfoMap *local_180;
  undefined1 auStack_178 [8];
  Name inlinedName;
  undefined1 local_160 [8];
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  inlinedInto;
  InliningState state;
  __node_base local_a8;
  Function *func_2;
  Function *inlinedFunction;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  undefined1 auStack_68 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> splitNames;
  
  this->module = module_;
  puVar5 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2f0 = (undefined1  [8])&iterationCounts._M_h._M_rehash_policy._M_next_resize;
  iterationCounts._M_h._M_buckets = (__buckets_ptr)0x1;
  iterationCounts._M_h._M_bucket_count = 0;
  iterationCounts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  iterationCounts._M_h._M_element_count._0_4_ = 0x3f800000;
  iterationCounts._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  iterationCounts._M_h._M_rehash_policy._4_4_ = 0;
  iterationCounts._M_h._M_rehash_policy._M_next_resize = 0;
  this_00 = &this->infos;
  state.actionsForFunction._M_h._M_single_bucket = local_1a8;
  uVar34 = 0;
  do {
    if ((ulong)((long)puVar5 - (long)puVar6 >> 3) < uVar34) break;
    local_160 = (undefined1  [8])&inlinedInto._M_h._M_rehash_policy._M_next_resize;
    inlinedInto._M_h._M_buckets = (__buckets_ptr)0x1;
    inlinedInto._M_h._M_bucket_count = 0;
    inlinedInto._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inlinedInto._M_h._M_element_count._0_4_ = 0x3f800000;
    inlinedInto._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    inlinedInto._M_h._M_rehash_policy._4_4_ = 0;
    inlinedInto._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&this_00->_M_h);
    puVar7 = (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar36 = (this->module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        p_Var25 = state.actionsForFunction._M_h._M_single_bucket, puVar36 != puVar7;
        puVar36 = puVar36 + 1) {
      std::
      unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
      ::operator[](this_00,(key_type *)
                           (puVar36->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
    inlinedUses._M_h._M_bucket_count = (size_type)&inlinedUses._M_h._M_element_count;
    inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inlinedUses._M_h._M_element_count._0_4_ = (uint)inlinedUses._M_h._M_element_count & 0xffffff00;
    inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
    inlinedUses._M_h._M_single_bucket = (__node_base_ptr)0x0;
    state.actionsForFunction._M_h._M_single_bucket[4]._M_nxt = (_Hash_node_base *)0x0;
    p_Var25[2]._M_nxt = (_Hash_node_base *)0x0;
    p_Var25[3]._M_nxt = (_Hash_node_base *)0x0;
    p_Var25->_M_nxt = (_Hash_node_base *)0x0;
    p_Var25[1]._M_nxt = (_Hash_node_base *)0x0;
    name.super_IString.str._M_str = (char *)&PTR__WalkerPass_00d88df8;
    inlinedUses._M_h._M_buckets = (__buckets_ptr)(this->super_Pass).runner;
    local_180 = this_00;
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
           *)&name.super_IString.str._M_str,this->module);
    pMVar38 = this->module;
    puVar8 = (pMVar38->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_188 = pMVar38;
    for (puVar43 = (pMVar38->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar43 != puVar8;
        puVar43 = puVar43 + 1) {
      pGVar9 = (puVar43->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar9->super_Importable).module + 8) == (char *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)&inlinedUses._M_h._M_rehash_policy._M_next_resize,&pGVar9->init);
      }
    }
    puVar10 = (pMVar38->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar44 = (pMVar38->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar44 != puVar10;
        puVar44 = puVar44 + 1) {
      pEVar11 = (puVar44->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (pEVar11->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)&inlinedUses._M_h._M_rehash_policy._M_next_resize,&pEVar11->offset);
      }
      pEVar11 = (puVar44->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      ppEVar12 = *(pointer *)
                  ((long)&(pEVar11->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                  + 8);
      for (ppEVar42 = *(pointer *)
                       &(pEVar11->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl; ppEVar42 != ppEVar12; ppEVar42 = ppEVar42 + 1) {
        inlinedInto._M_h._M_single_bucket = (__node_base_ptr)*ppEVar42;
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)&inlinedUses._M_h._M_rehash_policy._M_next_resize,
               (Expression **)&inlinedInto._M_h._M_single_bucket);
      }
    }
    puVar13 = (pMVar38->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar45 = (pMVar38->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar45 != puVar13;
        puVar45 = puVar45 + 1) {
      pDVar14 = (puVar45->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar14->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)&inlinedUses._M_h._M_rehash_policy._M_next_resize,&pDVar14->offset);
      }
    }
    local_188 = (Module *)0x0;
    if (local_1a8[0]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete(local_1a8[0]._M_nxt,local_198 - (long)local_1a8[0]._M_nxt);
    }
    name.super_IString.str._M_str = (char *)&PTR__Pass_00d87048;
    if ((size_type *)inlinedUses._M_h._M_bucket_count != &inlinedUses._M_h._M_element_count) {
      operator_delete((void *)inlinedUses._M_h._M_bucket_count,
                      CONCAT44(inlinedUses._M_h._M_element_count._4_4_,
                               (uint)inlinedUses._M_h._M_element_count) + 1);
    }
    puVar15 = (this->module->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar35 = (this->module->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar35 != puVar15;
        puVar35 = puVar35 + 1) {
      pEVar16 = (puVar35->_M_t).
                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar16->kind == Function) {
        pmVar28 = std::
                  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                  ::operator[](this_00,&pEVar16->value);
        pmVar28->usedGlobally = true;
      }
    }
    pMVar38 = this->module;
    if ((pMVar38->start).super_IString.str._M_str != (char *)0x0) {
      pMVar38 = (Module *)&pMVar38->start;
      pmVar28 = std::
                unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                ::operator[](this_00,(key_type *)pMVar38);
      pmVar28->usedGlobally = true;
    }
    pPVar17 = (this->super_Pass).runner;
    if ((2 < (pPVar17->options).optimizeLevel) && ((pPVar17->options).shrinkLevel == 0)) {
      pFVar29 = (FunctionSplitter *)operator_new(0x48);
      pFVar29->module = this->module;
      pFVar29->options = &pPVar17->options;
      (pFVar29->splits)._M_h._M_buckets = (__node_base_ptr *)((long)&(pFVar29->splits)._M_h + 0x30);
      *(size_type *)((long)&(pFVar29->splits)._M_h + 8) = 1;
      ((__node_base *)((long)&(pFVar29->splits)._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
      *(size_type *)((long)&(pFVar29->splits)._M_h + 0x18) = 0;
      ((_Prime_rehash_policy *)((long)&(pFVar29->splits)._M_h + 0x20))->_M_max_load_factor = 1.0;
      *(size_t *)((long)&(pFVar29->splits)._M_h + 0x28) = 0;
      *(__node_base_ptr *)((long)&(pFVar29->splits)._M_h + 0x30) = (__node_base_ptr)0x0;
      pFVar18 = (this->functionSplitter)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                _M_head_impl;
      (this->functionSplitter)._M_t.
      super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>._M_head_impl =
           pFVar29;
      if (pFVar18 != (FunctionSplitter *)0x0) {
        std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>::operator()
                  ((default_delete<wasm::(anonymous_namespace)::FunctionSplitter> *)pFVar18,
                   (FunctionSplitter *)pMVar38);
      }
    }
    inlinedInto._M_h._M_single_bucket =
         (__node_base_ptr)&state.worthInlining._M_h._M_rehash_policy._M_next_resize;
    state.worthInlining._M_h._M_buckets = (__buckets_ptr)0x1;
    state.worthInlining._M_h._M_bucket_count = 0;
    state.worthInlining._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    pFVar39 = (Function *)0x3f800000;
    state.worthInlining._M_h._M_element_count._0_4_ = 0x3f800000;
    state.worthInlining._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.worthInlining._M_h._M_rehash_policy._4_4_ = 0;
    state.worthInlining._M_h._M_rehash_policy._M_next_resize = 0;
    state.worthInlining._M_h._M_single_bucket =
         (__node_base_ptr)&state.actionsForFunction._M_h._M_rehash_policy._M_next_resize;
    state.actionsForFunction._M_h._M_buckets = (__buckets_ptr)0x1;
    state.actionsForFunction._M_h._M_bucket_count = 0;
    state.actionsForFunction._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    state.actionsForFunction._M_h._M_element_count._0_4_ = 0x3f800000;
    state.actionsForFunction._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.actionsForFunction._M_h._M_rehash_policy._4_4_ = 0;
    state.actionsForFunction._M_h._M_rehash_policy._M_next_resize = 0;
    puVar7 = (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar36 = (this->module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar7;
        puVar36 = puVar36 + 1) {
      pFVar40 = (puVar36->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar40->super_Importable).module + 8) == (char *)0x0) {
        _Var41._M_nxt = *(_Hash_node_base **)&(pFVar40->super_Importable).super_Named;
        inlinedUses._M_h._M_buckets =
             *(__buckets_ptr *)
              &(((_Hash_node_value<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
                  *)((long)&(pFVar40->super_Importable).super_Named + 8))->
               super__Hash_node_value_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>
               )._M_storage._M_storage.__align;
        name_00.super_IString.str = *(IString *)&(pFVar40->super_Importable).super_Named;
        name.super_IString.str._M_str = (char *)_Var41._M_nxt;
        pmVar28 = std::
                  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                  ::operator[](this_00,(key_type *)&name.super_IString.str._M_str);
        pFVar39 = (Function *)&((this->super_Pass).runner)->options;
        bVar27 = FunctionInfo::worthInlining(pmVar28,(PassOptions *)pFVar39);
        if (bVar27) {
LAB_00744fc7:
          name.super_IString.str._M_str = (char *)&inlinedInto._M_h._M_single_bucket;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)name.super_IString.str._M_str,pFVar40,&name.super_IString.str._M_str);
          pFVar39 = pFVar40;
        }
        else {
          pFVar18 = (this->functionSplitter)._M_t.
                    super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                    .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                    _M_head_impl;
          if (pFVar18 != (FunctionSplitter *)0x0) {
            func_00 = Module::getFunction(this->module,name_00);
            bVar27 = canHandleParams(func_00);
            pFVar39 = (Function *)_Var41._M_nxt;
            if ((bVar27) &&
               (bVar27 = FunctionSplitter::maybeSplit(pFVar18,func_00,(Function **)0x0),
               pFVar39 = func_00, bVar27)) goto LAB_00744fc7;
          }
        }
      }
    }
    this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
               *)state.actionsForFunction._M_h._M_bucket_count;
    if (state.worthInlining._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      inlinedFunction = (Function *)0x0;
      funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar7 = (this->module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar36 = (this->module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          p_Var25 = state.actionsForFunction._M_h._M_single_bucket, puVar36 != puVar7;
          puVar36 = puVar36 + 1) {
        std::
        unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
        ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                      *)&state.worthInlining._M_h._M_single_bucket,
                     (key_type *)
                     (puVar36->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        pFVar39 = (puVar36->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)&inlinedFunction,
                     (iterator)
                     funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start,(Name *)pFVar39);
        }
        else {
          pcVar24 = *(char **)((long)&(pFVar39->super_Importable).super_Named + 8);
          ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len =
               *(size_t *)&(pFVar39->super_Importable).super_Named;
          ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar24;
          funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      inlinedUses._M_h._M_bucket_count = (size_type)&inlinedUses._M_h._M_element_count;
      inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      inlinedUses._M_h._M_element_count._0_4_ = (uint)inlinedUses._M_h._M_element_count & 0xffffff00
      ;
      inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
      inlinedUses._M_h._M_single_bucket = (__node_base_ptr)0x0;
      state.actionsForFunction._M_h._M_single_bucket[4]._M_nxt = (_Hash_node_base *)0x0;
      p_Var25[2]._M_nxt = (_Hash_node_base *)0x0;
      p_Var25[3]._M_nxt = (_Hash_node_base *)0x0;
      p_Var25->_M_nxt = (_Hash_node_base *)0x0;
      p_Var25[1]._M_nxt = (_Hash_node_base *)0x0;
      name.super_IString.str._M_str = (char *)&PTR__WalkerPass_00d88e50;
      local_180 = (NameInfoMap *)&inlinedInto._M_h._M_single_bucket;
      inlinedUses._M_h._M_buckets = (__buckets_ptr)(this->super_Pass).runner;
      WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
      ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
             *)&name.super_IString.str._M_str,this->module);
      if (local_1a8[0]._M_nxt != (_Hash_node_base *)0x0) {
        operator_delete(local_1a8[0]._M_nxt,local_198 - (long)local_1a8[0]._M_nxt);
      }
      name.super_IString.str._M_str = (char *)&PTR__Pass_00d87048;
      if ((size_type *)inlinedUses._M_h._M_bucket_count != &inlinedUses._M_h._M_element_count) {
        operator_delete((void *)inlinedUses._M_h._M_bucket_count,
                        CONCAT44(inlinedUses._M_h._M_element_count._4_4_,
                                 (uint)inlinedUses._M_h._M_element_count) + 1);
      }
      pNVar26 = funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start;
      name.super_IString.str._M_str = (char *)&inlinedUses._M_h._M_rehash_policy._M_next_resize;
      inlinedUses._M_h._M_buckets = (__buckets_ptr)0x1;
      inlinedUses._M_h._M_bucket_count = 0;
      inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      inlinedUses._M_h._M_element_count._0_4_ = 0x3f800000;
      inlinedUses._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      inlinedUses._M_h._M_rehash_policy._4_4_ = 0;
      inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
      for (pFVar39 = inlinedFunction; pFVar39 != (Function *)pNVar26;
          pFVar39 = (Function *)&(pFVar39->super_Importable).super_Named.hasExplicitName) {
        auStack_298 = (undefined1  [8])
                      (pFVar39->super_Importable).super_Named.name.super_IString.str._M_len;
        name.super_IString.str._M_len =
             (size_t)(pFVar39->super_Importable).super_Named.name.super_IString.str._M_str;
        local_a8._M_nxt =
             (_Hash_node_base *)
             Module::getFunction(this->module,
                                 (Name)(pFVar39->super_Importable).super_Named.name.super_IString.
                                       str);
        sVar30 = std::
                 _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::count((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&name.super_IString.str._M_str,(key_type *)local_a8._M_nxt);
        if (sVar30 == 0) {
          pmVar31 = std::
                    unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                    ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                  *)&state.worthInlining._M_h._M_single_bucket,
                                 (key_type *)auStack_298);
          action = (pmVar31->
                   super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pIVar19 = (pmVar31->
                    super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          while( true ) {
            if (action == pIVar19) break;
            func_2 = action->contents;
            sVar32 = std::
                     _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)local_160,&func_2);
            if (sVar32 == 0) {
              iterationCounts._M_h._M_single_bucket =
                   (__node_base_ptr)
                   (func_2->super_Importable).super_Named.name.super_IString.str._M_len;
              inlinedName.super_IString.str._M_len =
                   (size_t)(func_2->super_Importable).super_Named.name.super_IString.str._M_str;
              auStack_68 = (undefined1  [8])
                           (((Importable *)&(local_a8._M_nxt)->_M_nxt)->super_Named).name.
                           super_IString.str._M_len;
              splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start = *(pointer *)(local_a8._M_nxt + 1);
              auStack_178 = (undefined1  [8])iterationCounts._M_h._M_single_bucket;
              pmVar28 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](this_00,(key_type *)auStack_68);
              IVar2 = pmVar28->size;
              pmVar28 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](this_00,(key_type *)&iterationCounts._M_h._M_single_bucket);
              if ((double)(IVar2 + pmVar28->size) * 2.5 < 409600.0) {
                auVar37 = (undefined1  [8])action->contents;
                pmVar28 = std::
                          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                          ::operator[](this_00,(key_type *)auVar37);
                bVar27 = FunctionInfo::worthInlining(pmVar28,&((this->super_Pass).runner)->options);
                if (!bVar27) {
                  pFVar18 = (this->functionSplitter)._M_t.
                            super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                            .
                            super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>
                            ._M_head_impl;
                  if (pFVar18 == (FunctionSplitter *)0x0) {
                    __assert_fail("functionSplitter",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x460,
                                  "Function *wasm::(anonymous namespace)::Inlining::getActuallyInlinedFunction(Function *)"
                                 );
                  }
                  auStack_68 = (undefined1  [8])0x0;
                  bVar27 = FunctionSplitter::maybeSplit
                                     (pFVar18,(Function *)auVar37,(Function **)auStack_68);
                  auVar37 = auStack_68;
                  if (!bVar27 || auStack_68 == (undefined1  [8])0x0) {
                    __assert_fail("success && inlineable",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x22f,
                                  "Function *wasm::(anonymous namespace)::FunctionSplitter::getInlineableSplitFunction(Function *)"
                                 );
                  }
                }
                action->contents = (Function *)auVar37;
                doInlining(this->module,(Function *)local_a8._M_nxt,action,
                           &((this->super_Pass).runner)->options);
                pmVar33 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&name.super_IString.str._M_str,(key_type *)auStack_178);
                *pmVar33 = *pmVar33 + 1;
                auStack_68 = (undefined1  [8])local_160;
                std::
                _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<wasm::Function*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                          ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_160,&local_a8,auStack_68);
                pmVar33 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&name.super_IString.str._M_str,(key_type *)auStack_178);
                uVar3 = *pmVar33;
                pmVar28 = std::
                          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                          ::operator[](this_00,(key_type *)auStack_178);
                if ((pmVar28->refs).super___atomic_base<unsigned_int>._M_i < uVar3) {
                  __assert_fail("inlinedUses[inlinedName] <= infos[inlinedName].refs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp"
                                ,0x432,
                                "void wasm::(anonymous namespace)::Inlining::iteration(std::unordered_set<Function *> &)"
                               );
                }
              }
            }
            action = action + 1;
          }
        }
      }
      if ((this->optimize == true) &&
         (inlinedInto._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0)) {
        OptUtils::optimizeAfterInlining
                  ((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                    *)local_160,this->module,(this->super_Pass).runner);
      }
      splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&name.super_IString.str._M_str;
      splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:1081:29)>
                    ::_M_invoke;
      splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)std::
                    _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:1081:29)>
                    ::_M_manager;
      pFVar39 = (Function *)auStack_68;
      auStack_68 = (undefined1  [8])this;
      Module::removeFunctions(this->module,(function<bool_(wasm::Function_*)> *)pFVar39);
      if (splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        pFVar39 = (Function *)auStack_68;
        (*(code *)splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_finish)(pFVar39,pFVar39,3);
      }
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&name.super_IString.str._M_str);
      this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                 *)state.actionsForFunction._M_h._M_bucket_count;
      if (inlinedFunction != (Function *)0x0) {
        pFVar39 = (Function *)
                  ((long)funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)inlinedFunction);
        operator_delete(inlinedFunction,(ulong)pFVar39);
        this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                   *)state.actionsForFunction._M_h._M_bucket_count;
      }
    }
    while (this_01 !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
            *)0x0) {
      p_Var20 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                  **)this_01;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
      ::_M_deallocate_node(this_01,(__node_ptr)pFVar39);
      this_01 = p_Var20;
    }
    memset(state.worthInlining._M_h._M_single_bucket,0,
           (long)state.actionsForFunction._M_h._M_buckets << 3);
    state.actionsForFunction._M_h._M_bucket_count = 0;
    state.actionsForFunction._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((__node_base_ptr)&state.actionsForFunction._M_h._M_rehash_policy._M_next_resize !=
        state.worthInlining._M_h._M_single_bucket) {
      operator_delete(state.worthInlining._M_h._M_single_bucket,
                      (long)state.actionsForFunction._M_h._M_buckets << 3);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&inlinedInto._M_h._M_single_bucket);
    bVar27 = true;
    puVar46 = (undefined8 *)inlinedInto._M_h._M_bucket_count;
    if (inlinedInto._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      for (; puVar47 = (undefined8 *)inlinedInto._M_h._M_bucket_count, puVar46 != (undefined8 *)0x0;
          puVar46 = (undefined8 *)*puVar46) {
        EHUtils::handleBlockNestedPops((Function *)puVar46[1],this->module);
      }
      for (; puVar47 != (undefined8 *)0x0; puVar47 = (undefined8 *)*puVar47) {
        pmVar33 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_2f0,(key_type *)puVar47[1]);
        mVar4 = *pmVar33;
        *pmVar33 = mVar4 + 1;
        if (4 < mVar4 + 1) goto LAB_00745715;
      }
      pFVar18 = (this->functionSplitter)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                _M_head_impl;
      if (pFVar18 != (FunctionSplitter *)0x0) {
        auStack_68 = (undefined1  [8])0x0;
        splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        name.super_IString.str._M_str = (char *)&inlinedUses._M_h._M_rehash_policy._M_next_resize;
        inlinedUses._M_h._M_buckets = (__buckets_ptr)0x1;
        inlinedUses._M_h._M_bucket_count = 0;
        inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        inlinedUses._M_h._M_element_count._0_4_ = 0x3f800000;
        inlinedUses._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        inlinedUses._M_h._M_rehash_policy._4_4_ = 0;
        inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
        for (p_Var48 = ((__node_base *)((long)&(pFVar18->splits)._M_h + 0x10))->_M_nxt;
            p_Var48 != (_Hash_node_base *)0x0; p_Var48 = p_Var48->_M_nxt) {
          if (p_Var48[4]._M_nxt != (_Hash_node_base *)0x0) {
            inlinedInto._M_h._M_single_bucket = (__node_base_ptr)&name.super_IString.str._M_str;
            std::
            _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                      ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)inlinedInto._M_h._M_single_bucket,p_Var48[4]._M_nxt,
                       &inlinedInto._M_h._M_single_bucket);
            if (splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start ==
                splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<wasm::Name,std::allocator<wasm::Name>>::
              _M_realloc_insert<wasm::Name_const&>
                        ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_68,
                         (iterator)
                         splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                         _M_impl.super__Vector_impl_data._M_start,(Name *)(p_Var48 + 1));
            }
            else {
              uVar21 = *(undefined4 *)((long)&p_Var48[1]._M_nxt + 4);
              uVar22 = *(undefined4 *)&p_Var48[2]._M_nxt;
              uVar23 = *(undefined4 *)((long)&p_Var48[2]._M_nxt + 4);
              *(int *)&((splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_len =
                   (int)(((Name *)(p_Var48 + 1))->super_IString).str._M_len;
              *(undefined4 *)
               ((long)&((splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_len + 4) =
                   uVar21;
              *(undefined4 *)
               &((splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_IString).str._M_str = uVar22;
              *(undefined4 *)
               ((long)&((splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_str + 4) =
                   uVar23;
              splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start =
                   splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
          }
        }
        state.worthInlining._M_h._M_buckets = (__buckets_ptr)0x0;
        inlinedInto._M_h._M_single_bucket = (__node_base_ptr)&name.super_IString.str._M_str;
        state.worthInlining._M_h._M_before_begin._M_nxt =
             (_Hash_node_base *)
             std::
             _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:578:29)>
             ::_M_invoke;
        state.worthInlining._M_h._M_bucket_count =
             (size_type)
             std::
             _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:578:29)>
             ::_M_manager;
        Module::removeFunctions
                  (pFVar18->module,
                   (function<bool_(wasm::Function_*)> *)&inlinedInto._M_h._M_single_bucket);
        if (state.worthInlining._M_h._M_bucket_count != 0) {
          pp_Var1 = &inlinedInto._M_h._M_single_bucket;
          (*(code *)state.worthInlining._M_h._M_bucket_count)(pp_Var1,pp_Var1,3);
        }
        std::
        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&name.super_IString.str._M_str);
        pNVar26 = splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar27 = false;
        for (auVar37 = auStack_68; auVar37 != (undefined1  [8])pNVar26;
            auVar37 = (undefined1  [8])
                      &(((Function *)auVar37)->super_Importable).super_Named.hasExplicitName) {
          name.super_IString.str._M_str =
               (char *)(((Function *)auVar37)->super_Importable).super_Named.name.super_IString.str.
                       _M_len;
          inlinedUses._M_h._M_buckets =
               (__buckets_ptr)
               (((Function *)auVar37)->super_Importable).super_Named.name.super_IString.str._M_str;
          pmVar33 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_2f0,(key_type *)&name.super_IString.str._M_str);
          mVar4 = *pmVar33;
          *pmVar33 = mVar4 + 1;
          if (4 < mVar4 + 1) {
            bVar27 = true;
            break;
          }
        }
        if (auStack_68 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_68,
                          (long)splitNames.
                                super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)auStack_68);
        }
        if (auVar37 != (undefined1  [8])pNVar26) goto LAB_00745715;
      }
      bVar27 = false;
    }
LAB_00745715:
    std::
    _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_160);
    uVar34 = (ulong)((int)uVar34 + 1);
  } while (!bVar27);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_2f0);
  return;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    // No point to do more iterations than the number of functions, as it means
    // we are infinitely recursing (which should be very rare in practice, but
    // it is possible that a recursive call can look like it is worth inlining).
    Index iterationNumber = 0;

    auto numOriginalFunctions = module->functions.size();

    // Track in how many iterations a function was inlined into. We are willing
    // to inline many times into a function within an iteration, as e.g. that
    // helps the case of many calls of a small getter. However, if we only do
    // more inlining in separate iterations then it is likely code that was the
    // result of previous inlinings that is now being inlined into. That is, an
    // old inlining added a call to somewhere, and now we are inlining into that
    // call. This is typically recursion, which to some extent can help, but
    // then like loop unrolling it loses its benefit quickly, so set a limit
    // here.
    //
    // In addition to inlining into a function, we track how many times we do
    // other potentially repetitive operations like splitting a function before
    // inlining, as any such repetitive operation should be limited in how many
    // times we perform it. (An exception is how many times we inlined a
    // function, which we do not want to limit - it can be profitable to inline
    // a call into a great many callsites, over many iterations.)
    //
    // (Track names here, and not Function pointers, as we can remove functions
    // while inlining, and it may be confusing during debugging to have a
    // pointer to something that was removed.)
    std::unordered_map<Name, Index> iterationCounts;

    const size_t MaxIterationsForFunc = 5;

    while (iterationNumber <= numOriginalFunctions) {
#ifdef INLINING_DEBUG
      std::cout << "inlining loop iter " << iterationNumber
                << " (numFunctions: " << module->functions.size() << ")\n";
#endif
      iterationNumber++;

      std::unordered_set<Function*> inlinedInto;

      prepare();
      iteration(inlinedInto);

      if (inlinedInto.empty()) {
        return;
      }

#ifdef INLINING_DEBUG
      std::cout << "  inlined into " << inlinedInto.size() << " funcs.\n";
#endif

      for (auto* func : inlinedInto) {
        EHUtils::handleBlockNestedPops(func, *module);
      }

      for (auto* func : inlinedInto) {
        if (++iterationCounts[func->name] >= MaxIterationsForFunc) {
          return;
        }
      }

      if (functionSplitter) {
        auto splitNames = functionSplitter->finish();
        for (auto name : splitNames) {
          if (++iterationCounts[name] >= MaxIterationsForFunc) {
            return;
          }
        }
      }
    }
  }